

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O0

int satoko_solve(solver_t *s)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  int local_1c;
  int status;
  solver_t *s_local;
  
  local_1c = 0;
  if (s == (solver_t *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver_api.c"
                  ,0x13e,"int satoko_solve(solver_t *)");
  }
  solver_clean_stats(s);
  if (s->status == 0) {
    printf("Satoko in inconsistent state\n");
    s_local._4_4_ = 0;
  }
  else if (((s->opts).no_simplify == '\0') && (iVar2 = satoko_simplify(s), iVar2 != 1)) {
    s_local._4_4_ = 0;
  }
  else {
    while (local_1c == 0) {
      cVar1 = solver_search(s);
      local_1c = (int)cVar1;
      uVar3 = solver_check_limits(s);
      if ((((uVar3 == 0) || (iVar2 = solver_stop(s), iVar2 != 0)) ||
          ((s->nRuntimeLimit != 0 && (aVar4 = Abc_Clock(), s->nRuntimeLimit < aVar4)))) ||
         ((s->pFuncStop != (_func_int_int *)0x0 && (iVar2 = (*s->pFuncStop)(s->RunId), iVar2 != 0)))
         ) break;
    }
    if ((s->opts).verbose != '\0') {
      print_stats(s);
    }
    uVar3 = vec_uint_size(s->assumptions);
    solver_cancel_until(s,uVar3);
    s_local._4_4_ = local_1c;
  }
  return s_local._4_4_;
}

Assistant:

int satoko_solve(solver_t *s)
{
    int status = SATOKO_UNDEC;

    assert(s);
    solver_clean_stats(s);
    //if (s->opts.verbose)
    //    print_opts(s);
    if (s->status == SATOKO_ERR) {
        printf("Satoko in inconsistent state\n");
        return SATOKO_UNDEC;
    }

    if (!s->opts.no_simplify)
        if (satoko_simplify(s) != SATOKO_OK)
            return SATOKO_UNDEC;

    while (status == SATOKO_UNDEC) {
        status = solver_search(s);
        if (solver_check_limits(s) == 0 || solver_stop(s))
            break;
        if (s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit)
            break;
        if (s->pFuncStop && s->pFuncStop(s->RunId))
            break;
    }
    if (s->opts.verbose)
        print_stats(s);
    
    solver_cancel_until(s, vec_uint_size(s->assumptions));
    return status;
}